

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::echo(TestMoreStuffImpl *this,EchoContext context)

{
  Builder result;
  Reader params;
  undefined1 local_b0 [24];
  CallContext<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  local_98;
  Maybe<capnp::MessageSize> local_90;
  Builder local_78;
  Reader local_50;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  ::getParams(&local_50,&local_98);
  local_90.ptr.isSet = false;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  ::getResults(&local_78,&local_98,&local_90);
  capnproto_test::capnp::test::TestMoreStuff::EchoParams::Reader::getCap
            ((Client *)local_b0,&local_50);
  capnproto_test::capnp::test::TestMoreStuff::EchoResults::Builder::setCap
            (&local_78,(Client *)local_b0);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_b0 + 8));
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::echo(EchoContext context) {
  ++callCount;
  auto params = context.getParams();
  auto result = context.getResults();
  result.setCap(params.getCap());
  return kj::READY_NOW;
}